

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

miniscript_item_t * search_miniscript_info(char *name,int target)

{
  int iVar1;
  size_t sVar2;
  size_t name_len;
  size_t max;
  size_t index;
  miniscript_item_t *result;
  int target_local;
  char *name_local;
  
  sVar2 = strlen(name);
  max = 0;
  while( true ) {
    if (0x1a < max) {
      return (miniscript_item_t *)0x0;
    }
    if (((miniscript_info_table[max].kind & target) != 0) &&
       (iVar1 = memcmp(name,miniscript_info_table[max].name,sVar2 + 1), iVar1 == 0)) break;
    max = max + 1;
  }
  return miniscript_info_table + max;
}

Assistant:

static const struct miniscript_item_t *search_miniscript_info(const char *name, int target)
{
    const struct miniscript_item_t *result = NULL;
    size_t index;
    size_t max = sizeof(miniscript_info_table) / sizeof(struct miniscript_item_t);
    size_t name_len = strlen(name) + 1;

    for (index = 0; index < max; ++index) {
        if ((miniscript_info_table[index].kind & target) == 0)
            continue;
        if (memcmp(name, miniscript_info_table[index].name, name_len) == 0) {
            result = &miniscript_info_table[index];
            break;
        }
    }
    return result;
}